

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int plan2d(PlannerType plannerType,char *envCfgFilename,bool forwardSearch)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  size_type sVar5;
  FILE *__stream;
  reference pvVar6;
  byte in_DL;
  undefined4 in_EDI;
  uint i;
  FILE *fSol;
  char *sol;
  SBPLPlanner *planner;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  EnvironmentNAV2D environment_nav2D;
  bool bforwardsearch;
  bool bsearchuntilfirstsolution;
  MDPConfig MDPCfg;
  double initialEpsilon;
  double allocated_time_secs;
  int bRet;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  SBPL_Exception *in_stack_fffffffffffffca0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcb0;
  uint local_2bc;
  ARAPlanner *local_2a8;
  vector<int,_std::allocator<int>_> local_2a0;
  _IO_FILE local_278 [2];
  byte local_32;
  byte local_31;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  int local_18;
  byte local_11;
  undefined4 local_4;
  
  local_32 = in_DL & 1;
  local_18 = 0;
  local_20 = 0x4059000000000000;
  local_28 = 0x4008000000000000;
  local_31 = 0;
  local_11 = local_32;
  local_4 = in_EDI;
  EnvironmentNAV2D::EnvironmentNAV2D((EnvironmentNAV2D *)local_278);
  bVar1 = EnvironmentNAV2D::InitializeEnv((char *)local_278);
  if ((bVar1 & 1) == 0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              (in_stack_fffffffffffffca0,
               (char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  bVar1 = EnvironmentNAV2D::InitializeMDPCfg((MDPConfig *)local_278);
  if ((bVar1 & 1) == 0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              (in_stack_fffffffffffffca0,
               (char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10c765);
  local_2a8 = (ARAPlanner *)0x0;
  switch(local_4) {
  case 0:
    printf("Initializing ADPlanner...\n");
    local_2a8 = (ARAPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner
              ((ADPlanner *)local_2a8,(DiscreteSpaceInformation *)local_278,(bool)(local_32 & 1));
    break;
  case 1:
    printf("Initializing ARAPlanner...\n");
    local_2a8 = (ARAPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner(local_2a8,(DiscreteSpaceInformation *)local_278,(bool)(local_32 & 1));
    break;
  default:
    printf("Invalid planner type\n");
    break;
  case 3:
    printf("Initializing RSTARPlanner...\n");
    local_2a8 = (ARAPlanner *)operator_new(0x68);
    RSTARPlanner::RSTARPlanner
              ((RSTARPlanner *)local_2a8,(DiscreteSpaceInformation *)local_278,(bool)(local_32 & 1))
    ;
    break;
  case 5:
    printf("Initializing anaPlanner...\n");
    local_2a8 = (ARAPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner
              ((anaPlanner *)local_2a8,(DiscreteSpaceInformation *)local_278,(bool)(local_32 & 1));
  }
  (**(code **)(*(long *)local_2a8 + 0x40))(local_2a8,local_31 & 1);
  iVar2 = (**(code **)(*(long *)local_2a8 + 0x28))(local_2a8,local_30);
  if (iVar2 == 0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              (in_stack_fffffffffffffca0,
               (char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = (**(code **)(*(long *)local_2a8 + 0x20))(local_2a8,local_2c);
  if (iVar2 == 0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              (in_stack_fffffffffffffca0,
               (char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  (**(code **)(*(long *)local_2a8 + 0x90))(local_28);
  printf("start planning...\n");
  local_18 = (*(code *)**(undefined8 **)local_2a8)(local_20,local_2a8,&local_2a0);
  printf("done planning\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"size of solution=");
  sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_2a0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  EnvironmentNAV2D::PrintTimeStat(local_278);
  __stream = fopen("sol.txt","w");
  if (__stream == (FILE *)0x0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              (in_stack_fffffffffffffca0,
               (char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  for (local_2bc = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_2a0),
      local_2bc < sVar5; local_2bc = local_2bc + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_2a0,(ulong)local_2bc);
    EnvironmentNAV2D::PrintState((int)local_278,SUB41(*pvVar6,0),(_IO_FILE *)0x0);
  }
  fclose(__stream);
  EnvironmentNAV2D::PrintTimeStat(local_278);
  if (local_18 == 0) {
    printf("Solution does not exist\n");
  }
  else {
    printf("Solution is found\n");
  }
  fflush((FILE *)0x0);
  if (local_2a8 != (ARAPlanner *)0x0) {
    (**(code **)(*(long *)local_2a8 + 0xa0))();
  }
  iVar2 = local_18;
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffcb0);
  EnvironmentNAV2D::~EnvironmentNAV2D((EnvironmentNAV2D *)local_278);
  return iVar2;
}

Assistant:

int plan2d(PlannerType plannerType, char* envCfgFilename, bool forwardSearch)
{
    int bRet = 0;
    double allocated_time_secs = 100.0; // in seconds
    double initialEpsilon = 3.0;
    MDPConfig MDPCfg;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    // Initialize Environment (should be called before initializing anything else)
    EnvironmentNAV2D environment_nav2D;
    if (!environment_nav2D.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // Initialize MDP Info
    if (!environment_nav2D.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Initializing RSTARPlanner...\n");
        planner = new RSTARPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_nav2D, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    // set search mode
    planner->set_search_mode(bsearchuntilfirstsolution);

    if (planner->set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }

    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }

    planner->set_initialsolution_eps(initialEpsilon);

    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    std::cout << "size of solution=" << solution_stateIDs_V.size() << std::endl;

    environment_nav2D.PrintTimeStat(stdout);

    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }
    for (unsigned int i = 0; i < solution_stateIDs_V.size(); i++) {
        environment_nav2D.PrintState(solution_stateIDs_V[i], false, fSol);
    }
    fclose(fSol);

    environment_nav2D.PrintTimeStat(stdout);

    //print a path
    if (bRet) {
        //print the solution
        printf("Solution is found\n");
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    delete planner;

    return bRet;
}